

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int net_tcp_send(NETSOCKET sock,void *data,int size)

{
  long lVar1;
  ssize_t sVar2;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int bytes;
  undefined4 local_38;
  undefined4 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = -1;
  uStack_10 = (int)((ulong)in_RDI >> 0x20);
  if (-1 < in_RDI) {
    sVar2 = send(uStack_10,in_RDX,(long)in_ECX,0);
    local_38 = (int)sVar2;
  }
  if (-1 < in_ESI) {
    sVar2 = send(in_ESI,in_RDX,(long)in_ECX,0);
    local_38 = (int)sVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

int net_tcp_send(NETSOCKET sock, const void *data, int size)
{
	int bytes = -1;

	if(sock.ipv4sock >= 0)
		bytes = send((int)sock.ipv4sock, (const char*)data, size, 0);
	if(sock.ipv6sock >= 0)
		bytes = send((int)sock.ipv6sock, (const char*)data, size, 0);

	return bytes;
}